

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::OutputLine(cmRST *this,string *line_in,bool inlineMarkup)

{
  RegularExpression *this_00;
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  string text;
  string line;
  string local_70;
  string local_50;
  
  if (this->OutputLinePending == true) {
    std::operator<<(this->OS,"\n");
    this->OutputLinePending = false;
  }
  if (!inlineMarkup) {
    poVar2 = std::operator<<(this->OS,(string *)line_in);
    std::operator<<(poVar2,"\n");
    return;
  }
  ReplaceSubstitutions(&line,this,line_in);
  this_00 = &this->CMakeRole;
  pcVar4 = (char *)0x0;
  do {
    bVar1 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p + (long)pcVar4);
    poVar2 = this->OS;
    if (!bVar1) {
      std::__cxx11::string::substr((ulong)&text,(ulong)&line);
      poVar2 = std::operator<<(poVar2,(string *)&text);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&text);
      std::__cxx11::string::~string((string *)&line);
      return;
    }
    std::__cxx11::string::substr((ulong)&text,(ulong)&line);
    std::operator<<(poVar2,(string *)&text);
    std::__cxx11::string::~string((string *)&text);
    cmsys::RegularExpression::match_abi_cxx11_(&text,this_00,3);
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,this_00,2);
    bVar1 = std::operator==(&local_50,"command");
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_70,this_00,5);
      if (local_70._M_string_length != 0) {
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_00307064;
      }
      lVar3 = std::__cxx11::string::find_first_of((char *)&text,0x4bd2b4);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if (lVar3 == -1) {
        std::__cxx11::string::append((char *)&text);
      }
    }
    else {
LAB_00307064:
      std::__cxx11::string::~string((string *)&local_50);
    }
    poVar2 = std::operator<<(this->OS,"``");
    poVar2 = std::operator<<(poVar2,(string *)&text);
    std::operator<<(poVar2,"``");
    pcVar4 = (this->CMakeRole).endp[0] + ((long)pcVar4 - (long)(this->CMakeRole).searchstring);
    std::__cxx11::string::~string((string *)&text);
  } while( true );
}

Assistant:

void cmRST::OutputLine(std::string const& line_in, bool inlineMarkup)
{
  if(this->OutputLinePending)
    {
    this->OS << "\n";
    this->OutputLinePending = false;
    }
  if(inlineMarkup)
    {
    std::string line = this->ReplaceSubstitutions(line_in);
    std::string::size_type pos = 0;
    while(this->CMakeRole.find(line.c_str()+pos))
      {
      this->OS << line.substr(pos, this->CMakeRole.start());
      std::string text = this->CMakeRole.match(3);
      // If a command reference has no explicit target and
      // no explicit "(...)" then add "()" to the text.
      if(this->CMakeRole.match(2) == "command" &&
         this->CMakeRole.match(5).empty() &&
         text.find_first_of("()") == text.npos)
        {
        text += "()";
        }
      this->OS << "``" << text << "``";
      pos += this->CMakeRole.end();
      }
    this->OS << line.substr(pos) << "\n";
    }
  else
    {
    this->OS << line_in << "\n";
    }
}